

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSamplePercentage::Deserialize
          (ReservoirSamplePercentage *this,Deserializer *deserializer)

{
  tuple<duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
  this_00;
  pointer pRVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
  local_28;
  double local_20;
  
  local_20 = Deserializer::ReadProperty<double>(deserializer,200,"sample_percentage");
  this_00.
  super__Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
  .super__Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
        )operator_new(0x60);
  ReservoirSamplePercentage
            ((ReservoirSamplePercentage *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
             .super__Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false>._M_head_impl,
             local_20,-1);
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
  .super__Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false>._M_head_impl =
       (tuple<duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
        )(tuple<duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
           .super__Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false>._M_head_impl;
  pRVar1 = unique_ptr<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"reservoir_sample_size",&pRVar1->reservoir_sample_size);
  (this->super_BlockingSample)._vptr_BlockingSample =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSamplePercentage_*,_std::default_delete<duckdb::ReservoirSamplePercentage>_>
       .super__Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSamplePercentage::Deserialize(Deserializer &deserializer) {
	auto sample_percentage = deserializer.ReadProperty<double>(200, "sample_percentage");
	auto result = duckdb::unique_ptr<ReservoirSamplePercentage>(new ReservoirSamplePercentage(sample_percentage));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "reservoir_sample_size", result->reservoir_sample_size);
	return std::move(result);
}